

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O0

void __thiscall lsim::ModelCircuit::disconnect_pin(ModelCircuit *this,pin_id_t pin)

{
  bool bVar1;
  pointer pMVar2;
  size_t sVar3;
  reference puVar4;
  iterator iStack_78;
  uint id;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  reference local_50;
  pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  wire_lut_t *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> empty_wires;
  pin_id_t pin_local;
  ModelCircuit *this_local;
  
  empty_wires.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pin;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  __end1 = std::
           unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
           ::begin(&this->m_wires);
  pair = (pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>
          *)std::
            unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>_>_>
            ::end(&this->m_wires);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false>
                         *)&pair);
    if (!bVar1) break;
    local_50 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
               ::operator*(&__end1);
    pMVar2 = std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::operator->
                       (&local_50->second);
    ModelWire::remove_pin
              (pMVar2,(pin_id_t)
                      empty_wires.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    pMVar2 = std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::operator->
                       (&local_50->second);
    sVar3 = ModelWire::num_pins(pMVar2);
    if (sVar3 == 0) {
      pMVar2 = std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>::operator->
                         (&local_50->second);
      __range1_1._0_4_ = ModelWire::id(pMVar2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                 (value_type_conflict2 *)&__range1_1);
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelWire,_std::default_delete<lsim::ModelWire>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  iStack_78 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff88);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_1);
    remove_wire(this,*puVar4);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1_1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  return;
}

Assistant:

void ModelCircuit::disconnect_pin(pin_id_t pin) {
    std::vector<uint32_t> empty_wires;

    for (auto &pair : m_wires) {
        pair.second->remove_pin(pin);
        if (pair.second->num_pins() == 0) {
            empty_wires.push_back(pair.second->id());
        }
    }

    for (const auto id : empty_wires) {
        remove_wire(id);
    }
}